

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void __thiscall
HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::~HashTable
          (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this)

{
  SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *buffer;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < this->tableSize; uVar3 = uVar3 + 1) {
    this_00 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    pSVar1 = this->table + uVar3;
    buffer = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
             this->table[uVar3].super_SListNodeBase<Memory::ArenaAllocator>.next;
    while (buffer != pSVar1) {
      pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               (buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (this_00,buffer,0x18);
      buffer = pSVar2;
    }
    (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next =
         &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
    (pSVar1->super_RealCount).count = 0;
  }
  return;
}

Assistant:

~HashTable()
    {
        for (uint i = 0; i< tableSize; i++)
        {
            table[i].Clear(alloc);
        }
    }